

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O1

void __thiscall LogWriter::reportEdge(LogWriter *this,uint v1,uint v2)

{
  _Rb_tree_header *p_Var1;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_00;
  size_t *psVar2;
  undefined8 *******pppppppuVar3;
  undefined8 *******pppppppuVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _List_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  _Node_alloc_type *__alloc_1;
  _Node_alloc_type *__alloc;
  bool bVar10;
  _Rb_tree_color local_50;
  uint local_4c;
  undefined8 *******local_48;
  undefined8 *******pppppppuStack_40;
  undefined8 local_38;
  
  p_Var1 = &(this->vertices_)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->vertices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar10]) {
    bVar10 = p_Var8[1]._M_color < v1;
    if (!bVar10) {
      p_Var6 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var8 = p_Var6, v1 < p_Var6[1]._M_color)) {
    p_Var8 = &p_Var1->_M_header;
  }
  this_00 = &this->vertices_;
  local_50 = v2;
  local_4c = v1;
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    local_38 = 0;
    local_48 = &local_48;
    pppppppuStack_40 = &local_48;
    pmVar5 = std::
             map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](this_00,&local_4c);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (pmVar5,&local_48);
    pppppppuVar4 = local_48;
    while ((undefined8 ********)pppppppuVar4 != &local_48) {
      pppppppuVar3 = (undefined8 *******)*pppppppuVar4;
      operator_delete(pppppppuVar4);
      pppppppuVar4 = pppppppuVar3;
    }
  }
  p_Var8 = (this->vertices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0; p_Var8 = (&p_Var8->_M_left)[bVar10]) {
    bVar10 = (_Rb_tree_color)*(size_t *)(p_Var8 + 1) < local_50;
    if (!bVar10) {
      p_Var6 = p_Var8;
    }
  }
  p_Var9 = p_Var1;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var9 = (_Rb_tree_header *)p_Var6,
     local_50 < (_Rb_tree_color)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
    p_Var9 = p_Var1;
  }
  if (p_Var9 == p_Var1) {
    local_38 = 0;
    local_48 = &local_48;
    pppppppuStack_40 = &local_48;
    pmVar5 = std::
             map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](this_00,&local_50);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (pmVar5,&local_48);
    pppppppuVar4 = local_48;
    while ((undefined8 ********)pppppppuVar4 != &local_48) {
      pppppppuVar3 = (undefined8 *******)*pppppppuVar4;
      operator_delete(pppppppuVar4);
      pppppppuVar4 = pppppppuVar3;
    }
  }
  pmVar5 = std::
           map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](this_00,&local_4c);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  *(_Rb_tree_color *)&p_Var7[1]._M_next = local_50;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar2 = &(pmVar5->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
            _M_size;
  *psVar2 = *psVar2 + 1;
  pmVar5 = std::
           map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](this_00,&local_50);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  *(uint *)&p_Var7[1]._M_next = local_4c;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar2 = &(pmVar5->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
            _M_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void reportEdge(unsigned int v1, unsigned int v2) {
        if (vertices_.count(v1) == 0) vertices_[v1] = std::list<unsigned int>();
        if (vertices_.count(v2) == 0) vertices_[v2] = std::list<unsigned int>();

        vertices_[v1].push_back(v2);
        vertices_[v2].push_back(v1);
    }